

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quirrel_parser.cpp
# Opt level: O0

Node * __thiscall Parser::parseConstStatement(Parser *this,Token *const_token,bool is_global)

{
  byte bVar1;
  size_type sVar2;
  reference ppNVar3;
  Node *pNVar4;
  byte in_DL;
  Parser *in_RSI;
  Node *in_RDI;
  Node *unaff_retaddr;
  Node *check;
  Node *value;
  Node *name;
  TokenType in_stack_000000a4;
  Parser *in_stack_000000a8;
  Parser *in_stack_00000198;
  int in_stack_00000248;
  int in_stack_0000024c;
  char *in_stack_00000250;
  int in_stack_0000025c;
  CompilationContext *in_stack_00000260;
  Node *local_30;
  undefined7 in_stack_ffffffffffffffe8;
  undefined1 is_global_00;
  
  bVar1 = in_DL & 1;
  expect(in_stack_000000a8,in_stack_000000a4);
  createIdentifierNode(in_RSI,(Token *)CONCAT17(bVar1,in_stack_ffffffffffffffe8));
  is_global_00 = (undefined1)((ulong)in_RSI >> 0x38);
  expect(in_stack_000000a8,in_stack_000000a4);
  local_30 = parseTernaryOp(in_stack_00000198);
  if ((local_30->nodeType == PNT_UNARY_PRE_OP) && (local_30->tok->type == TK_MINUS)) {
    sVar2 = std::vector<Node_*,_std::allocator<Node_*>_>::size(&local_30->children);
    if (sVar2 == 1) {
      ppNVar3 = std::vector<Node_*,_std::allocator<Node_*>_>::operator[](&local_30->children,0);
      if ((*ppNVar3)->nodeType != PNT_FLOAT) {
        ppNVar3 = std::vector<Node_*,_std::allocator<Node_*>_>::operator[](&local_30->children,0);
        if ((*ppNVar3)->nodeType != PNT_INTEGER) goto LAB_001216fe;
      }
      ppNVar3 = std::vector<Node_*,_std::allocator<Node_*>_>::operator[](&local_30->children,0);
      local_30 = *ppNVar3;
    }
  }
LAB_001216fe:
  if ((((local_30 != (Node *)0x0) && (local_30->nodeType != PNT_INTEGER)) &&
      (local_30->nodeType != PNT_BOOL)) &&
     ((local_30->nodeType != PNT_FLOAT && (local_30->nodeType != PNT_STRING)))) {
    CompilationContext::error
              (in_stack_00000260,in_stack_0000025c,in_stack_00000250,in_stack_0000024c,
               in_stack_00000248);
  }
  pNVar4 = createConstDeclarationNode
                     ((Parser *)value,(Token *)check,unaff_retaddr,in_RDI,(bool)is_global_00);
  return pNVar4;
}

Assistant:

Node * parseConstStatement(Token * const_token, bool is_global)
  {
    expect(TK_IDENTIFIER);
    Node * name = createIdentifierNode(*tok);
    expect(TK_ASSIGN);
    Node * value = parseTernaryOp();

#define ACCEPT_ONLY_SCALAR_CONST 1
#if (ACCEPT_ONLY_SCALAR_CONST)
    Node * check = value;
    if (check->nodeType == PNT_UNARY_PRE_OP && check->tok.type == TK_MINUS && check->children.size() == 1 &&
      (check->children[0]->nodeType == PNT_FLOAT || check->children[0]->nodeType == PNT_INTEGER))
    {
      check = value->children[0];
    }

    if (check && check->nodeType != PNT_INTEGER && check->nodeType != PNT_BOOL && check->nodeType != PNT_FLOAT &&
      check->nodeType != PNT_STRING)
    {
      ctx.error(130, "expected scalar (boolean, integer, float, string)", check->tok.line, check->tok.column);
    }

#endif

    return createConstDeclarationNode(*const_token, name, value, is_global);
  }